

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase *
CreateCast(ExpressionContext *ctx,SynBase *source,ExprBase *value,TypeBase *type,
          bool isFunctionArgument)

{
  TypeStruct *pTVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ExprBase *pEVar7;
  undefined4 extraout_var;
  ExprFunctionAccess *this;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TypeBase *pTVar8;
  undefined4 extraout_var_03;
  TypeRef *pTVar9;
  VariableHandle *pVVar10;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  SynBase *pSVar11;
  VariableData *pVVar12;
  undefined4 extraout_var_15;
  _func_int **pp_Var13;
  ExprBase *pEVar14;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  ExprBase *pEVar15;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  ScopeData *pSVar16;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  ExprError *pEVar17;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  TypeUnsizedArray *type_00;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  FunctionData *pFVar18;
  undefined4 extraout_var_35;
  ExprGetAddress *this_00;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  ExprBase *pEVar19;
  TypeStruct *pTVar20;
  ScopeData *pSVar21;
  TypeBase *pTVar22;
  ScopeData *pSVar23;
  ExprFunctionDefinition *definition;
  undefined7 in_register_00000081;
  TypeFunction *type_01;
  InplaceStr name;
  InplaceStr name_00;
  FunctionValue function;
  undefined4 extraout_var_04;
  undefined4 extraout_var_16;
  
  this = (ExprFunctionAccess *)(CONCAT71(in_register_00000081,isFunctionArgument) & 0xffffffff);
  if ((value->type != (TypeBase *)0x0) && (value->type->typeID == 0)) {
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var_00,iVar5);
    pEVar7->typeID = 0x12;
    pEVar7->source = source;
    pEVar7->type = type;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
LAB_0014f049:
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002299e8;
    pEVar7[1]._vptr_ExprBase = (_func_int **)value;
    pEVar7[1].typeID = 0xd;
    return pEVar7;
  }
  if ((value == (ExprBase *)0x0) ||
     (definition = (ExprFunctionDefinition *)value, value->typeID != 0x24)) {
    definition = (ExprFunctionDefinition *)0x0;
  }
  if (definition != (ExprFunctionDefinition *)0x0) {
    pEVar7 = CreateFunctionPointer(ctx,source,definition,true);
    pEVar7 = CreateCast(ctx,source,pEVar7,type,SUB81(this,0));
    return pEVar7;
  }
  if (value->type == type) {
    AssertValueExpression(ctx,source,value);
    return value;
  }
  if ((type == (TypeBase *)0x0) || (type_01 = (TypeFunction *)type, type->typeID != 0x15)) {
    type_01 = (TypeFunction *)0x0;
  }
  bVar4 = true;
  if (type_01 != (TypeFunction *)0x0) {
    GetFunctionForType(&function,ctx,source,value,type_01);
    if (function.function != (FunctionData *)0x0) {
      if (((function.context)->type != (TypeBase *)0x0) &&
         ((function.context)->type->typeID == 0x10)) {
        anon_unknown.dwarf_9fd58::Stop
                  (ctx,source,"ERROR: can\'t convert dynamic function set to \'%.*s\'",
                   (ulong)(uint)(*(int *)&(type->name).end - (int)(type->name).begin));
      }
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      this = (ExprFunctionAccess *)CONCAT44(extraout_var,iVar5);
      ExprFunctionAccess::ExprFunctionAccess
                (this,function.source,type,function.function,function.context);
      if ((value != (ExprBase *)0x0) &&
         ((value->typeID == 0x24 || ((value != (ExprBase *)0x0 && (value->typeID == 0x25)))))) {
        this = (ExprFunctionAccess *)CreateSequence(ctx,source,value,(ExprBase *)this);
      }
    }
    if (function.function == (FunctionData *)0x0) {
      pTVar22 = value->type;
      if (pTVar22->isGeneric == true) {
        pcVar2 = (pTVar22->name).begin;
        pcVar3 = (type->name).begin;
        anon_unknown.dwarf_9fd58::Stop
                  (ctx,source,"ERROR: can\'t resolve generic type \'%.*s\' instance for \'%.*s\'",
                   (ulong)(uint)(*(int *)&(pTVar22->name).end - (int)pcVar2),pcVar2,
                   (ulong)(uint)(*(int *)&(type->name).end - (int)pcVar3),pcVar3);
      }
    }
    else {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    return &this->super_ExprBase;
  }
  bVar4 = AssertValueExpression(ctx,source,value);
  if (!bVar4) {
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var_02,iVar5);
    pEVar7->typeID = 0x12;
    pEVar7->source = source;
    pEVar7->type = type;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    goto LAB_0014f049;
  }
  pTVar22 = value->type;
  bVar4 = ExpressionContext::IsNumericType(ctx,pTVar22);
  if ((bVar4) && (bVar4 = ExpressionContext::IsNumericType(ctx,type), bVar4)) {
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var_01,iVar5);
    pEVar7->typeID = 0x12;
    pEVar7->source = source;
    pEVar7->type = type;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002299e8;
    pEVar7[1]._vptr_ExprBase = (_func_int **)value;
    pEVar7[1].typeID = 0;
    return pEVar7;
  }
  if ((ctx->typeBool == type) && (pTVar22 != (TypeBase *)0x0)) {
    if (pTVar22->typeID == 0x12) {
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar7 = (ExprBase *)CONCAT44(extraout_var_06,iVar5);
      pEVar7->typeID = 0x12;
      pEVar7->source = source;
      pEVar7->type = type;
      pEVar7->next = (ExprBase *)0x0;
      pEVar7->listed = false;
      pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002299e8;
      pEVar7[1]._vptr_ExprBase = (_func_int **)value;
      pEVar7[1].typeID = 1;
      return pEVar7;
    }
    if (pTVar22 != (TypeBase *)0x0) {
      if (pTVar22->typeID == 0x14) {
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pEVar7 = (ExprBase *)CONCAT44(extraout_var_09,iVar5);
        pEVar7->typeID = 0x12;
        pEVar7->source = source;
        pEVar7->type = type;
        pEVar7->next = (ExprBase *)0x0;
        pEVar7->listed = false;
        pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002299e8;
        pEVar7[1]._vptr_ExprBase = (_func_int **)value;
        pEVar7[1].typeID = 2;
        return pEVar7;
      }
      if ((pTVar22 != (TypeBase *)0x0) && (pTVar22->typeID == 0x15)) {
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pEVar7 = (ExprBase *)CONCAT44(extraout_var_12,iVar5);
        pEVar7->typeID = 0x12;
        pEVar7->source = source;
        pEVar7->type = type;
        pEVar7->next = (ExprBase *)0x0;
        pEVar7->listed = false;
        pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002299e8;
        pEVar7[1]._vptr_ExprBase = (_func_int **)value;
        pEVar7[1].typeID = 3;
        return pEVar7;
      }
    }
  }
  if (pTVar22 == ctx->typeNullPtr) {
    if ((type != (TypeBase *)0x0) && (type->typeID == 0x12)) {
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar7 = (ExprBase *)CONCAT44(extraout_var_07,iVar5);
      pEVar7->typeID = 0x12;
      pEVar7->source = source;
      pEVar7->type = type;
      pEVar7->next = (ExprBase *)0x0;
      pEVar7->listed = false;
      pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002299e8;
      pEVar7[1]._vptr_ExprBase = (_func_int **)value;
      pEVar7[1].typeID = 4;
      return pEVar7;
    }
    if (ctx->typeAutoRef == (TypeStruct *)type) {
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar7 = (ExprBase *)CONCAT44(extraout_var_11,iVar5);
      pEVar7->typeID = 0x12;
      pEVar7->source = source;
      pEVar7->type = type;
      pEVar7->next = (ExprBase *)0x0;
      pEVar7->listed = false;
      pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002299e8;
      pEVar7[1]._vptr_ExprBase = (_func_int **)value;
      pEVar7[1].typeID = 5;
      return pEVar7;
    }
    if ((type != (TypeBase *)0x0) && (type->typeID == 0x14)) {
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar7 = (ExprBase *)CONCAT44(extraout_var_08,iVar5);
      pEVar7->typeID = 0x12;
      pEVar7->source = source;
      pEVar7->type = type;
      pEVar7->next = (ExprBase *)0x0;
      pEVar7->listed = false;
      pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002299e8;
      pEVar7[1]._vptr_ExprBase = (_func_int **)value;
      pEVar7[1].typeID = 6;
      return pEVar7;
    }
    if (ctx->typeAutoArray == (TypeStruct *)type) {
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar7 = (ExprBase *)CONCAT44(extraout_var_13,iVar5);
      pEVar7->typeID = 0x12;
      pEVar7->source = source;
      pEVar7->type = type;
      pEVar7->next = (ExprBase *)0x0;
      pEVar7->listed = false;
      pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002299e8;
      pEVar7[1]._vptr_ExprBase = (_func_int **)value;
      pEVar7[1].typeID = 7;
      return pEVar7;
    }
    if (type != (TypeBase *)0x0) {
      if (type->typeID == 0x15) {
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pEVar7 = (ExprBase *)CONCAT44(extraout_var_10,iVar5);
        pEVar7->typeID = 0x12;
        pEVar7->source = source;
        pEVar7->type = type;
        pEVar7->next = (ExprBase *)0x0;
        pEVar7->listed = false;
        pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002299e8;
        pEVar7[1]._vptr_ExprBase = (_func_int **)value;
        pEVar7[1].typeID = 8;
        return pEVar7;
      }
      goto LAB_0014f185;
    }
LAB_0014f198:
    pTVar8 = (TypeBase *)0x0;
  }
  else {
LAB_0014f185:
    if ((type == (TypeBase *)0x0) || (pTVar8 = type, type->typeID != 0x14)) goto LAB_0014f198;
  }
  bVar4 = true;
  if (pTVar8 != (TypeBase *)0x0) {
    if ((pTVar22 == (TypeBase *)0x0) || (pTVar22->typeID != 0x13)) {
      pTVar22 = (TypeBase *)0x0;
    }
    if ((pTVar22 != (TypeBase *)0x0) &&
       (*(_func_int ***)&pTVar8[1].typeIndex == pTVar22[1]._vptr_TypeBase)) {
      if ((value == (ExprBase *)0x0) || (pEVar7 = value, value->typeID != 0x22)) {
        pEVar7 = (ExprBase *)0x0;
      }
      if (pEVar7 == (ExprBase *)0x0) {
        if ((value == (ExprBase *)0x0) || (pEVar7 = value, value->typeID != 0x16)) {
          pEVar7 = (ExprBase *)0x0;
        }
        bVar4 = pEVar7 == (ExprBase *)0x0;
        if (!bVar4) {
          iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          this = (ExprFunctionAccess *)CONCAT44(extraout_var_14,iVar5);
          pFVar18 = (FunctionData *)pEVar7[1]._vptr_ExprBase;
          goto LAB_0014f5b8;
        }
      }
      else {
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pFVar18 = (FunctionData *)CONCAT44(extraout_var_03,iVar5);
        pTVar9 = ExpressionContext::GetReferenceType(ctx,value->type);
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        pVVar10 = (VariableHandle *)CONCAT44(extraout_var_04,iVar5);
        pVVar12 = (VariableData *)pEVar7[1]._vptr_ExprBase;
        pVVar10->source = pEVar7->source;
        pVVar10->variable = pVVar12;
        pVVar10->next = (VariableHandle *)0x0;
        pVVar10->listed = false;
        ExprGetAddress::ExprGetAddress
                  ((ExprGetAddress *)pFVar18,source,&pTVar9->super_TypeBase,pVVar10);
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        this = (ExprFunctionAccess *)CONCAT44(extraout_var_05,iVar5);
LAB_0014f5b8:
        (this->super_ExprBase).typeID = 0x12;
        (this->super_ExprBase).source = source;
        (this->super_ExprBase).type = type;
        (this->super_ExprBase).next = (ExprBase *)0x0;
        (this->super_ExprBase).listed = false;
        (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002299e8;
        this->function = pFVar18;
        *(undefined4 *)&this->context = 9;
        bVar4 = false;
      }
      if (bVar4) {
        pSVar11 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
        pTVar9 = ExpressionContext::GetReferenceType(ctx,pTVar22);
        pVVar12 = anon_unknown.dwarf_9fd58::AllocateTemporary(ctx,pSVar11,&pTVar9->super_TypeBase);
        pEVar7 = CreateObjectAllocation(ctx,pSVar11,pTVar22);
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pEVar19 = (ExprBase *)CONCAT44(extraout_var_15,iVar5);
        pTVar8 = ctx->typeVoid;
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        pp_Var13 = (_func_int **)CONCAT44(extraout_var_16,iVar5);
        bVar4 = false;
        *pp_Var13 = (_func_int *)0x0;
        pp_Var13[1] = (_func_int *)pVVar12;
        pp_Var13[2] = (_func_int *)0x0;
        *(undefined1 *)(pp_Var13 + 3) = 0;
        pEVar14 = CreateVariableAccess(ctx,pSVar11,pVVar12,false);
        pEVar7 = CreateAssignment(ctx,pSVar11,pEVar14,pEVar7);
        pEVar19->typeID = 0x1e;
        pEVar19->source = pSVar11;
        pEVar19->type = pTVar8;
        pEVar19->next = (ExprBase *)0x0;
        pEVar19->listed = false;
        pEVar19->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229a58;
        pEVar19[1]._vptr_ExprBase = pp_Var13;
        *(ExprBase **)&pEVar19[1].typeID = pEVar7;
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar7 = (ExprBase *)CONCAT44(extraout_var_17,iVar5);
        pEVar14 = CreateVariableAccess(ctx,pSVar11,pVVar12,false);
        pEVar7->typeID = 0x16;
        pEVar7->source = pSVar11;
        pEVar7->type = pTVar22;
        pEVar7->next = (ExprBase *)0x0;
        pEVar7->listed = false;
        pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229a90;
        pEVar7[1]._vptr_ExprBase = (_func_int **)pEVar14;
        pEVar7 = CreateAssignment(ctx,pSVar11,pEVar7,value);
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pEVar14 = (ExprBase *)CONCAT44(extraout_var_18,iVar5);
        pEVar15 = CreateVariableAccess(ctx,pSVar11,pVVar12,false);
        pEVar14->typeID = 0x12;
        pEVar14->source = pSVar11;
        pEVar14->type = type;
        pEVar14->next = (ExprBase *)0x0;
        pEVar14->listed = false;
        pEVar14->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002299e8;
        pEVar14[1]._vptr_ExprBase = (_func_int **)pEVar15;
        pEVar14[1].typeID = 9;
        this = (ExprFunctionAccess *)CreateSequence(ctx,source,pEVar19,pEVar7,pEVar14);
      }
      else {
        bVar4 = false;
      }
    }
  }
  if (!bVar4) {
    return &this->super_ExprBase;
  }
  if ((type == (TypeBase *)0x0) || (pTVar22 = type, type->typeID != 0x12)) {
    pTVar22 = (TypeBase *)0x0;
  }
  bVar4 = true;
  if (pTVar22 != (TypeBase *)0x0) {
    pTVar1 = (TypeStruct *)value->type;
    if ((pTVar1 == (TypeStruct *)0x0) || (pTVar20 = pTVar1, (pTVar1->super_TypeBase).typeID != 0x12)
       ) {
      pTVar20 = (TypeStruct *)0x0;
    }
    if (pTVar20 == (TypeStruct *)0x0) {
      if (pTVar1 == ctx->typeAutoRef) {
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])();
        this = (ExprFunctionAccess *)CONCAT44(extraout_var_25,iVar5);
        (this->super_ExprBase).typeID = 0x12;
        (this->super_ExprBase).source = source;
        (this->super_ExprBase).type = type;
        (this->super_ExprBase).next = (ExprBase *)0x0;
        (this->super_ExprBase).listed = false;
        (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002299e8;
        this->function = (FunctionData *)value;
        *(undefined4 *)&this->context = 0xb;
LAB_0014fb8e:
        bVar4 = false;
      }
      else if ((isFunctionArgument) && (pTVar1 == (TypeStruct *)pTVar22[1]._vptr_TypeBase)) {
        if ((value == (ExprBase *)0x0) || (pEVar7 = value, value->typeID != 0x22)) {
          pEVar7 = (ExprBase *)0x0;
        }
        if (pEVar7 != (ExprBase *)0x0) {
          iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          this = (ExprFunctionAccess *)CONCAT44(extraout_var_23,iVar5);
          pTVar9 = ExpressionContext::GetReferenceType(ctx,value->type);
          iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
          pVVar10 = (VariableHandle *)CONCAT44(extraout_var_24,iVar5);
          pVVar12 = (VariableData *)pEVar7[1]._vptr_ExprBase;
          pVVar10->source = pEVar7->source;
          pVVar10->variable = pVVar12;
          pVVar10->next = (VariableHandle *)0x0;
          pVVar10->listed = false;
          ExprGetAddress::ExprGetAddress
                    ((ExprGetAddress *)this,source,&pTVar9->super_TypeBase,pVVar10);
          goto LAB_0014fb8e;
        }
        if ((value == (ExprBase *)0x0) || (pEVar7 = value, value->typeID != 0x16)) {
          pEVar7 = (ExprBase *)0x0;
        }
        if (pEVar7 != (ExprBase *)0x0) {
          this = (ExprFunctionAccess *)pEVar7[1]._vptr_ExprBase;
          goto LAB_001500cd;
        }
        pSVar11 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
        pVVar12 = anon_unknown.dwarf_9fd58::AllocateTemporary
                            (ctx,pSVar11,(TypeBase *)pTVar22[1]._vptr_TypeBase);
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pTVar22 = pVVar12->type;
        pEVar7 = CreateVariableAccess(ctx,pSVar11,pVVar12,false);
        pEVar7 = CreateGetAddress(ctx,pSVar11,pEVar7);
        ExprAssignment::ExprAssignment
                  ((ExprAssignment *)CONCAT44(extraout_var_36,iVar5),pSVar11,pTVar22,pEVar7,value);
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pEVar7 = (ExprBase *)CONCAT44(extraout_var_37,iVar6);
        pTVar22 = ctx->typeVoid;
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        pp_Var13 = (_func_int **)CONCAT44(extraout_var_38,iVar6);
        *pp_Var13 = (_func_int *)0x0;
        pp_Var13[1] = (_func_int *)pVVar12;
        pp_Var13[2] = (_func_int *)0x0;
        *(undefined1 *)(pp_Var13 + 3) = 0;
        pEVar7->typeID = 0x1e;
        pEVar7->source = pSVar11;
        pEVar7->type = pTVar22;
        pEVar7->next = (ExprBase *)0x0;
        pEVar7->listed = false;
        pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229a58;
        pEVar7[1]._vptr_ExprBase = pp_Var13;
        *(ExprAssignment **)&pEVar7[1].typeID = (ExprAssignment *)CONCAT44(extraout_var_36,iVar5);
        pEVar19 = CreateVariableAccess(ctx,pSVar11,pVVar12,false);
        pEVar19 = CreateGetAddress(ctx,pSVar11,pEVar19);
        this = (ExprFunctionAccess *)CreateSequence(ctx,source,pEVar7,pEVar19);
        bVar4 = false;
      }
    }
    else {
      pTVar8 = (TypeBase *)pTVar22[1]._vptr_TypeBase;
      if ((((pTVar8 != (TypeBase *)0x0) && (pTVar8->typeID == 0x14)) &&
          (pSVar23 = pTVar20->typeScope, pSVar23 != (ScopeData *)0x0)) &&
         (pSVar23->uniqueId == 0x13)) {
        if ((pTVar8 == (TypeBase *)0x0) || (pTVar8->typeID != 0x14)) {
          pTVar8 = (TypeBase *)0x0;
        }
        if (*(TypeBase **)&pTVar8[1].typeIndex == (pSVar23->types).little[1]) {
          pSVar11 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
          pVVar12 = anon_unknown.dwarf_9fd58::AllocateTemporary(ctx,pSVar11,pTVar8);
          pEVar7 = CreateVariableAccess(ctx,pSVar11,pVVar12,false);
          iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          pEVar19 = (ExprBase *)CONCAT44(extraout_var_19,iVar5);
          pEVar19->typeID = 0x12;
          pEVar19->source = pSVar11;
          pEVar19->type = pTVar8;
          pEVar19->next = (ExprBase *)0x0;
          pEVar19->listed = false;
          pEVar19->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002299e8;
          pEVar19[1]._vptr_ExprBase = (_func_int **)value;
          pEVar19[1].typeID = 9;
          pEVar7 = CreateAssignment(ctx,pSVar11,pEVar7,pEVar19);
          iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          pEVar19 = (ExprBase *)CONCAT44(extraout_var_20,iVar5);
          pTVar22 = ctx->typeVoid;
          iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
          pp_Var13 = (_func_int **)CONCAT44(extraout_var_21,iVar5);
          *pp_Var13 = (_func_int *)0x0;
          pp_Var13[1] = (_func_int *)pVVar12;
          pp_Var13[2] = (_func_int *)0x0;
          *(undefined1 *)(pp_Var13 + 3) = 0;
          pEVar19->typeID = 0x1e;
          pEVar19->source = pSVar11;
          pEVar19->type = pTVar22;
          pEVar19->next = (ExprBase *)0x0;
          pEVar19->listed = false;
          pEVar19->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229a58;
          pEVar19[1]._vptr_ExprBase = pp_Var13;
          *(ExprBase **)&pEVar19[1].typeID = pEVar7;
          pEVar7 = CreateVariableAccess(ctx,pSVar11,pVVar12,false);
          pEVar7 = CreateGetAddress(ctx,pSVar11,pEVar7);
          this = (ExprFunctionAccess *)CreateSequence(ctx,source,pEVar19,pEVar7);
          goto LAB_0014fb8e;
        }
      }
      bVar4 = true;
      pSVar23 = (ScopeData *)pTVar22[1]._vptr_TypeBase;
      if (((pSVar23 != (ScopeData *)0x0) && (pSVar23->uniqueId == 0x18)) &&
         ((pSVar16 = pTVar20->typeScope, pSVar16 != (ScopeData *)0x0 && (pSVar16->uniqueId == 0x18))
         )) {
        if ((pSVar23 == (ScopeData *)0x0) || (pSVar23->uniqueId != 0x18)) {
          pSVar23 = (ScopeData *)0x0;
        }
        if ((pSVar16 == (ScopeData *)0x0) || (pSVar16->uniqueId != 0x18)) {
          pSVar16 = (ScopeData *)0x0;
        }
        if (pSVar16 != (ScopeData *)0x0) {
          iVar5 = 0;
          pSVar21 = pSVar16;
          do {
            if (pSVar21 == pSVar23) goto LAB_0014fa3b;
            iVar5 = iVar5 + 1;
            pSVar21 = (ScopeData *)(pSVar21->scopes).allocator;
          } while (pSVar21 != (ScopeData *)0x0);
          iVar5 = -1;
LAB_0014fa3b:
          if (iVar5 != -1) {
            iVar5 = (*ctx->allocator->_vptr_Allocator[2])();
            this = (ExprFunctionAccess *)CONCAT44(extraout_var_22,iVar5);
            (this->super_ExprBase).typeID = 0x12;
            (this->super_ExprBase).source = source;
            (this->super_ExprBase).type = type;
            (this->super_ExprBase).next = (ExprBase *)0x0;
            (this->super_ExprBase).listed = false;
            (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002299e8;
            this->function = (FunctionData *)value;
            *(undefined4 *)&this->context = 0xd;
            goto LAB_0014fb8e;
          }
        }
        if (pSVar23 != (ScopeData *)0x0) {
          iVar5 = 0;
          pSVar21 = pSVar23;
          do {
            if (pSVar21 == pSVar16) goto LAB_0014fee6;
            iVar5 = iVar5 + 1;
            pSVar21 = (ScopeData *)(pSVar21->scopes).allocator;
          } while (pSVar21 != (ScopeData *)0x0);
          iVar5 = -1;
LAB_0014fee6:
          if (iVar5 != -1) {
            iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
            pEVar7 = (ExprBase *)CONCAT44(extraout_var_33,iVar5);
            pTVar9 = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
            pEVar7->typeID = 0x12;
            pEVar7->source = source;
            pEVar7->type = &pTVar9->super_TypeBase;
            pEVar7->next = (ExprBase *)0x0;
            pEVar7->listed = false;
            pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002299e8;
            pEVar7[1]._vptr_ExprBase = (_func_int **)value;
            pEVar7[1].typeID = 0xd;
            iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
            pEVar19 = (ExprBase *)CONCAT44(extraout_var_34,iVar5);
            pTVar22 = ctx->typeTypeID;
            pEVar19->typeID = 8;
            pEVar19->source = source;
            pEVar19->type = pTVar22;
            pEVar19->next = (ExprBase *)0x0;
            pEVar19->listed = false;
            pEVar19->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229580;
            pEVar19[1]._vptr_ExprBase = (_func_int **)pSVar23;
            name.end = "";
            name.begin = "__assert_derived_from";
            pFVar18 = (FunctionData *)
                      CreateFunctionCall2(ctx,source,name,pEVar7,pEVar19,false,false,true);
            iVar5 = (*ctx->allocator->_vptr_Allocator[2])();
            this = (ExprFunctionAccess *)CONCAT44(extraout_var_35,iVar5);
            (this->super_ExprBase).typeID = 0x12;
            (this->super_ExprBase).source = source;
            (this->super_ExprBase).type = type;
            (this->super_ExprBase).next = (ExprBase *)0x0;
            (this->super_ExprBase).listed = false;
            (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002299e8;
            this->function = pFVar18;
            *(undefined4 *)&this->context = 0xd;
LAB_001500cd:
            bVar4 = false;
          }
        }
      }
    }
  }
  if (!bVar4) {
    return &this->super_ExprBase;
  }
  if ((ctx->typeAutoRef == (TypeStruct *)type) && (pTVar22 = value->type, pTVar22 != ctx->typeVoid))
  {
    if ((pTVar22 != (TypeBase *)0x0) && (pTVar22->typeID == 0x12)) {
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar7 = (ExprBase *)CONCAT44(extraout_var_26,iVar5);
      pEVar7->typeID = 0x12;
      pEVar7->source = source;
      pEVar7->type = type;
      pEVar7->next = (ExprBase *)0x0;
      pEVar7->listed = false;
      pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002299e8;
      pEVar7[1]._vptr_ExprBase = (_func_int **)value;
      pEVar7[1].typeID = 10;
      return pEVar7;
    }
    if ((value == (ExprBase *)0x0) || (pEVar7 = value, value->typeID != 0x22)) {
      pEVar7 = (ExprBase *)0x0;
    }
    if (pEVar7 == (ExprBase *)0x0) {
      if ((value == (ExprBase *)0x0) || (pEVar7 = value, value->typeID != 0x16)) {
        pEVar7 = (ExprBase *)0x0;
      }
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar19 = (ExprBase *)CONCAT44(extraout_var_32,iVar5);
      if (pEVar7 == (ExprBase *)0x0) {
        pTVar9 = ExpressionContext::GetReferenceType(ctx,value->type);
        this_00 = (ExprGetAddress *)CreateCast(ctx,source,value,&pTVar9->super_TypeBase,true);
      }
      else {
        this_00 = (ExprGetAddress *)pEVar7[1]._vptr_ExprBase;
      }
    }
    else {
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      this_00 = (ExprGetAddress *)CONCAT44(extraout_var_28,iVar5);
      pTVar9 = ExpressionContext::GetReferenceType(ctx,value->type);
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      pVVar10 = (VariableHandle *)CONCAT44(extraout_var_29,iVar5);
      pVVar12 = (VariableData *)pEVar7[1]._vptr_ExprBase;
      pVVar10->source = pEVar7->source;
      pVVar10->variable = pVVar12;
      pVVar10->next = (VariableHandle *)0x0;
      pVVar10->listed = false;
      ExprGetAddress::ExprGetAddress(this_00,source,&pTVar9->super_TypeBase,pVVar10);
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar19 = (ExprBase *)CONCAT44(extraout_var_30,iVar5);
    }
    pEVar19->typeID = 0x12;
    pEVar19->source = source;
    pEVar19->type = type;
    pEVar19->next = (ExprBase *)0x0;
    pEVar19->listed = false;
    pEVar19->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002299e8;
    pEVar19[1]._vptr_ExprBase = (_func_int **)this_00;
    pEVar19[1].typeID = 10;
    if (isFunctionArgument) {
      return pEVar19;
    }
    name_00.end = "";
    name_00.begin = "duplicate";
    pEVar7 = CreateFunctionCall1(ctx,source,name_00,pEVar19,false,false,true);
    return pEVar7;
  }
  if (ctx->typeAutoArray != (TypeStruct *)type) goto LAB_0014fbbb;
  pTVar22 = value->type;
  if (pTVar22 == (TypeBase *)0x0) {
LAB_0014fdab:
    pTVar22 = (TypeBase *)0x0;
  }
  else {
    if (pTVar22->typeID == 0x14) {
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar7 = (ExprBase *)CONCAT44(extraout_var_27,iVar5);
      pEVar7->typeID = 0x12;
      pEVar7->source = source;
      pEVar7->type = type;
      pEVar7->next = (ExprBase *)0x0;
      pEVar7->listed = false;
      pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002299e8;
      pEVar7[1]._vptr_ExprBase = (_func_int **)value;
      pEVar7[1].typeID = 0xc;
      return pEVar7;
    }
    if ((pTVar22 == (TypeBase *)0x0) || (pTVar22->typeID != 0x13)) goto LAB_0014fdab;
  }
  if (pTVar22 != (TypeBase *)0x0) {
    type_00 = ExpressionContext::GetUnsizedArrayType(ctx,(TypeBase *)pTVar22[1]._vptr_TypeBase);
    pEVar7 = CreateCast(ctx,source,value,(TypeBase *)type_00,false);
    pEVar7 = CreateCast(ctx,source,pEVar7,type,false);
    return pEVar7;
  }
LAB_0014fbbb:
  pTVar1 = (TypeStruct *)value->type;
  if (pTVar1 == ctx->typeAutoRef) {
    if (type == (TypeBase *)0x0) {
      bVar4 = false;
    }
    else {
      bVar4 = type->typeID == 0x12;
    }
    if ((!bVar4) && (ctx->typeVoid != type)) {
      pTVar9 = ExpressionContext::GetReferenceType(ctx,type);
      pEVar7 = CreateCast(ctx,source,value,&pTVar9->super_TypeBase,false);
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      pEVar19 = (ExprBase *)CONCAT44(extraout_var_31,iVar5);
      pEVar19->typeID = 0x16;
      pEVar19->source = source;
      pEVar19->type = type;
      pEVar19->next = (ExprBase *)0x0;
      pEVar19->listed = false;
      pEVar19->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229a90;
      pEVar19[1]._vptr_ExprBase = (_func_int **)pEVar7;
      return pEVar19;
    }
  }
  pcVar2 = (pTVar1->super_TypeBase).name.begin;
  pcVar3 = (type->name).begin;
  pEVar17 = anon_unknown.dwarf_9fd58::ReportExpected
                      (ctx,source,type,"ERROR: cannot convert \'%.*s\' to \'%.*s\'",
                       (ulong)(uint)(*(int *)&(pTVar1->super_TypeBase).name.end - (int)pcVar2),
                       pcVar2,(ulong)(uint)(*(int *)&(type->name).end - (int)pcVar3),pcVar3);
  return &pEVar17->super_ExprBase;
}

Assistant:

ExprBase* CreateCast(ExpressionContext &ctx, SynBase *source, ExprBase *value, TypeBase *type, bool isFunctionArgument)
{
	if(isType<TypeError>(value->type))
		return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_REINTERPRET);

	// When function is used as value, hide its visibility immediately after use
	if(ExprFunctionDefinition *definition = getType<ExprFunctionDefinition>(value))
		return CreateCast(ctx, source, CreateFunctionPointer(ctx, source, definition, true), type, isFunctionArgument);

	if(value->type == type)
	{
		AssertValueExpression(ctx, source, value);

		return value;
	}

	if(TypeFunction *target = getType<TypeFunction>(type))
	{
		if(FunctionValue function = GetFunctionForType(ctx, source, value, target))
		{
			if(isType<TypeAutoRef>(function.context->type))
				Stop(ctx, source, "ERROR: can't convert dynamic function set to '%.*s'", FMT_ISTR(type->name));

			ExprBase *access = new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(function.source, type, function.function, function.context);

			if(isType<ExprFunctionDefinition>(value) || isType<ExprGenericFunctionPrototype>(value))
				return CreateSequence(ctx, source, value, access);

			return access;
		}

		if(value->type->isGeneric)
			Stop(ctx, source, "ERROR: can't resolve generic type '%.*s' instance for '%.*s'", FMT_ISTR(value->type->name), FMT_ISTR(type->name));
	}

	if(!AssertValueExpression(ctx, source, value))
		return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_REINTERPRET);

	if(ctx.IsNumericType(value->type) && ctx.IsNumericType(type))
		return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_NUMERICAL);

	if(type == ctx.typeBool)
	{
		if(isType<TypeRef>(value->type))
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_PTR_TO_BOOL);

		if(isType<TypeUnsizedArray>(value->type))
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_UNSIZED_TO_BOOL);

		if(isType<TypeFunction>(value->type))
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_FUNCTION_TO_BOOL);
	}

	if(value->type == ctx.typeNullPtr)
	{
		// nullptr to type ref conversion
		if(isType<TypeRef>(type))
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_NULL_TO_PTR);

		// nullptr to auto ref conversion
		if(type == ctx.typeAutoRef)
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_NULL_TO_AUTO_PTR);

		// nullptr to type[] conversion
		if(isType<TypeUnsizedArray>(type))
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_NULL_TO_UNSIZED);

		// nullptr to auto[] conversion
		if(type == ctx.typeAutoArray)
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_NULL_TO_AUTO_ARRAY);

		// nullptr to function type conversion
		if(isType<TypeFunction>(type))
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_NULL_TO_FUNCTION);
	}

	if(TypeUnsizedArray *target = getType<TypeUnsizedArray>(type))
	{
		// type[N] to type[] conversion
		if(TypeArray *valueType = getType<TypeArray>(value->type))
		{
			if(target->subType == valueType->subType)
			{
				if(ExprVariableAccess *node = getType<ExprVariableAccess>(value))
				{
					ExprBase *address = new (ctx.get<ExprGetAddress>()) ExprGetAddress(source, ctx.GetReferenceType(value->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));

					return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, address, EXPR_CAST_ARRAY_PTR_TO_UNSIZED);
				}
				else if(ExprDereference *node = getType<ExprDereference>(value))
				{
					return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, node->value, EXPR_CAST_ARRAY_PTR_TO_UNSIZED);
				}

				// Allocate storage in heap and copy literal data into it
				SynBase *sourceInternal = ctx.MakeInternal(source);

				VariableData *storage = AllocateTemporary(ctx, sourceInternal, ctx.GetReferenceType(valueType));

				ExprBase *alloc = CreateObjectAllocation(ctx, sourceInternal, valueType);

				ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(sourceInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, storage), CreateAssignment(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false), alloc));

				ExprBase *assignment = CreateAssignment(ctx, sourceInternal, new (ctx.get<ExprDereference>()) ExprDereference(sourceInternal, valueType, CreateVariableAccess(ctx, sourceInternal, storage, false)), value);

				ExprBase *result = new (ctx.get<ExprTypeCast>()) ExprTypeCast(sourceInternal, type, CreateVariableAccess(ctx, sourceInternal, storage, false), EXPR_CAST_ARRAY_PTR_TO_UNSIZED);

				return CreateSequence(ctx, source, definition, assignment, result);
			}
		}
	}

	if(TypeRef *target = getType<TypeRef>(type))
	{
		if(TypeRef *valueType = getType<TypeRef>(value->type))
		{
			// type[N] ref to type[] ref conversion
			if(isType<TypeUnsizedArray>(target->subType) && isType<TypeArray>(valueType->subType))
			{
				TypeUnsizedArray *targetSub = getType<TypeUnsizedArray>(target->subType);
				TypeArray *sourceSub = getType<TypeArray>(valueType->subType);

				if(targetSub->subType == sourceSub->subType)
				{
					SynBase *sourceInternal = ctx.MakeInternal(source);

					VariableData *storage = AllocateTemporary(ctx, sourceInternal, targetSub);

					ExprBase *assignment = CreateAssignment(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false), new (ctx.get<ExprTypeCast>()) ExprTypeCast(sourceInternal, targetSub, value, EXPR_CAST_ARRAY_PTR_TO_UNSIZED));

					ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(sourceInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, storage), assignment);

					ExprBase *result = CreateGetAddress(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false));

					return CreateSequence(ctx, source, definition, result);
				}
			}

			if(isType<TypeClass>(target->subType) && isType<TypeClass>(valueType->subType))
			{
				TypeClass *targetClass = getType<TypeClass>(target->subType);
				TypeClass *valueClass = getType<TypeClass>(valueType->subType);

				if(IsDerivedFrom(valueClass, targetClass))
					return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_REINTERPRET);

				if(IsDerivedFrom(targetClass, valueClass))
				{
					ExprBase *untyped = new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, ctx.GetReferenceType(ctx.typeVoid), value, EXPR_CAST_REINTERPRET);
					ExprBase *typeID = new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, targetClass);

					ExprBase *checked = CreateFunctionCall2(ctx, source, InplaceStr("__assert_derived_from"), untyped, typeID, false, false, true);

					return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, checked, EXPR_CAST_REINTERPRET);
				}
			}
		}
		else if(value->type == ctx.typeAutoRef)
		{
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_AUTO_PTR_TO_PTR);
		}
		else if(isFunctionArgument && value->type == target->subType)
		{
			// type to type ref conversion
			if(ExprVariableAccess *node = getType<ExprVariableAccess>(value))
			{
				ExprBase *address = new (ctx.get<ExprGetAddress>()) ExprGetAddress(source, ctx.GetReferenceType(value->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));

				return address;
			}
			else if(ExprDereference *node = getType<ExprDereference>(value))
			{
				return node->value;
			}
			else if(target->subType == value->type)
			{
				SynBase *sourceInternal = ctx.MakeInternal(source);

				VariableData *storage = AllocateTemporary(ctx, sourceInternal, target->subType);

				ExprBase *assignment = new (ctx.get<ExprAssignment>()) ExprAssignment(sourceInternal, storage->type, CreateGetAddress(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false)), value);

				ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(sourceInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, storage), assignment);

				ExprBase *result = CreateGetAddress(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false));

				return CreateSequence(ctx, source, definition, result);
			}
		}
	}

	if(type == ctx.typeAutoRef && value->type != ctx.typeVoid)
	{
		// type ref to auto ref conversion
		if(isType<TypeRef>(value->type))
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_PTR_TO_AUTO_PTR);

		ExprTypeCast *typeCast = NULL;

		// type to auto ref conversion
		if(ExprVariableAccess *node = getType<ExprVariableAccess>(value))
		{
			ExprBase *address = new (ctx.get<ExprGetAddress>()) ExprGetAddress(source, ctx.GetReferenceType(value->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));

			typeCast = new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, address, EXPR_CAST_PTR_TO_AUTO_PTR);
		}
		else if(ExprDereference *node = getType<ExprDereference>(value))
		{
			typeCast = new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, node->value, EXPR_CAST_PTR_TO_AUTO_PTR);
		}
		else
		{
			typeCast = new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, CreateCast(ctx, source, value, ctx.GetReferenceType(value->type), true), EXPR_CAST_PTR_TO_AUTO_PTR);
		}

		if(isFunctionArgument)
			return typeCast;

		// type to auto ref conversion (boxing)
		return CreateFunctionCall1(ctx, source, InplaceStr("duplicate"), typeCast, false, false, true);
	}

	if(type == ctx.typeAutoArray)
	{
		// type[] to auto[] conversion
		if(isType<TypeUnsizedArray>(value->type))
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_UNSIZED_TO_AUTO_ARRAY);
		
		if(TypeArray *valueType = getType<TypeArray>(value->type))
		{
			ExprBase *unsized = CreateCast(ctx, source, value, ctx.GetUnsizedArrayType(valueType->subType), false);

			return CreateCast(ctx, source, unsized, type, false);
		}
	}

	if(value->type == ctx.typeAutoRef)
	{
		// auto ref to type (unboxing)
		if(!isType<TypeRef>(type) && type != ctx.typeVoid)
		{
			ExprBase *ptr = CreateCast(ctx, source, value, ctx.GetReferenceType(type), false);

			return new (ctx.get<ExprDereference>()) ExprDereference(source, type, ptr);
		}
	}

	return ReportExpected(ctx, source, type, "ERROR: cannot convert '%.*s' to '%.*s'", FMT_ISTR(value->type->name), FMT_ISTR(type->name));
}